

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture1DView *src,float *texCoord,ReferenceParams *params)

{
  int iVar1;
  LodMode mode;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  ulong uVar9;
  deInt32 srcSize;
  int y;
  Vec3 *w;
  int px;
  int x_00;
  int x;
  int iVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 extraout_XMM0 [16];
  float width;
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float wx;
  Texture1DView TVar27;
  Texture1DView src_1;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture1DView view;
  Texture1DView src_2;
  Vec4 uq;
  float local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  Vec3 local_138;
  Vec3 VStack_12c;
  float local_118;
  float fStack_114;
  Texture1DView local_108 [2];
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_e8;
  Vec4 *local_c8;
  Vec4 *local_c0;
  Texture1DView local_b8;
  Texture1DView local_a8;
  Vector<float,_4> local_98;
  int local_88 [2];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ulong local_78 [2];
  IVec2 local_68 [2];
  Vec3 local_58;
  float fStack_4c;
  undefined8 local_48;
  TextureTestUtil local_40 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  TVar27 = getSubView(src,params->baseLevel,params->maxLevel);
  local_b8.m_levels = TVar27.m_levels;
  local_b8.m_numLevels = TVar27.m_numLevels;
  uVar3 = *(undefined8 *)texCoord;
  uVar4 = *(undefined8 *)(texCoord + 2);
  local_98.m_data._0_8_ = uVar3;
  local_98.m_data._8_8_ = uVar4;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar27 = tcu::getEffectiveTextureView
                       (&local_b8,
                        (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)&local_e8,&params->sampler);
    local_108[0].m_levels = TVar27.m_levels;
    local_108[0].m_numLevels = TVar27.m_numLevels;
    fVar26 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      fVar26 = (params->super_RenderParams).bias;
    }
    local_68[0].m_data[0] = dst->m_width;
    local_68[0].m_data[1] = dst->m_height;
    srcSize = 0;
    local_188 = (float)uVar3;
    fStack_184 = SUB84(uVar3,4);
    fStack_180 = (float)uVar4;
    fStack_17c = SUB84(uVar4,4);
    if (0 < local_108[0].m_numLevels) {
      srcSize = ((local_108[0].m_levels)->m_size).m_data[0];
    }
    local_138.m_data[0] = local_188;
    local_138.m_data[1] = fStack_184;
    local_138.m_data[2] = fStack_180;
    VStack_12c.m_data[0] = fStack_17c;
    VStack_12c.m_data[2] = fStack_184;
    VStack_12c.m_data[1] = fStack_180;
    local_118 = computeNonProjectedTriLod(params->lodMode,local_68,srcSize,&local_138);
    uVar5 = params->minLod;
    uVar6 = params->baseLevel;
    uVar7 = params->maxLevel;
    fVar23 = params->maxLod;
    fStack_114 = extraout_XMM0_Db;
    fVar13 = computeNonProjectedTriLod(params->lodMode,local_68,srcSize,&VStack_12c);
    auVar24._4_4_ = params->maxLod;
    auVar24._0_4_ = fVar23;
    auVar24._8_8_ = 0;
    auVar25._4_4_ = fVar13 + fVar26;
    auVar25._0_4_ = local_118 + fVar26;
    auVar25._8_4_ = fStack_114 + fVar26;
    auVar25._12_4_ = extraout_XMM0_Db_00 + fVar26;
    auVar25 = minps(auVar24,auVar25);
    uVar11 = -(uint)(local_118 + fVar26 < (float)uVar5);
    uVar12 = -(uint)(fVar13 + fVar26 < params->minLod);
    auVar16._0_8_ = CONCAT44((uint)params->minLod & uVar12,uVar5 & uVar11);
    auVar16._8_4_ = uVar6 & -(uint)(fStack_114 + fVar26 < (float)uVar6);
    auVar16._12_4_ = uVar7 & -(uint)(extraout_XMM0_Db_00 + fVar26 < (float)uVar7);
    local_78[0] = CONCAT44(~uVar12 & auVar25._4_4_,~uVar11 & auVar25._0_4_) | auVar16._0_8_;
    for (iVar8 = 0; iVar8 < dst->m_height; iVar8 = iVar8 + 1) {
      auVar17._4_12_ = auVar16._4_12_;
      auVar17._0_4_ = (float)iVar8 + 0.5;
      auVar25 = auVar17;
      for (iVar10 = 0; iVar10 < dst->m_width; iVar10 = iVar10 + 1) {
        auVar18._4_12_ = auVar25._4_12_;
        auVar18._0_4_ = (float)iVar10 + 0.5;
        fStack_184 = auVar16._4_4_;
        auVar20._12_4_ = auVar25._12_4_;
        auVar20._0_8_ = auVar18._0_8_;
        auVar20._8_4_ = auVar25._4_4_;
        auVar19._8_8_ = auVar20._8_8_;
        auVar19._4_4_ = auVar17._0_4_;
        auVar19._0_4_ = auVar18._0_4_;
        auVar21._0_12_ = auVar19._0_12_;
        auVar21._12_4_ = fStack_184;
        auVar22._0_4_ = (float)dst->m_width;
        auVar22._4_4_ = (float)dst->m_height;
        auVar22._8_8_ = 0;
        auVar25 = divps(auVar21,auVar22);
        fVar26 = auVar25._4_4_;
        bVar2 = 1.0 <= auVar25._0_4_ + fVar26;
        if (bVar2) {
          auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
          if (!bVar2) goto LAB_008a3e71;
LAB_008a3e62:
          fVar23 = auVar25._0_4_;
          fVar26 = 1.0 - fVar26;
        }
        else {
          if (bVar2) goto LAB_008a3e62;
LAB_008a3e71:
          fVar23 = auVar25._0_4_;
        }
        uVar9 = (ulong)bVar2;
        fVar13 = (&local_138)[uVar9].m_data[0];
        execSample((TextureTestUtil *)local_88,local_108,params,
                   ((&local_138)[uVar9].m_data[1] - fVar13) * fVar26 +
                   ((&VStack_12c)[uVar9 - 1].m_data[2] - fVar13) * fVar23 + fVar13,
                   *(float *)((long)local_78 + uVar9 * 4));
        tcu::operator*((tcu *)&local_a8,(Vector<float,_4> *)local_88,
                       &(params->super_RenderParams).colorScale);
        tcu::operator+((tcu *)&local_58,(Vector<float,_4> *)&local_a8,
                       &(params->super_RenderParams).colorBias);
        tcu::SurfaceAccess::setPixel(dst,(Vec4 *)&local_58,iVar10,iVar8);
        auVar25 = extraout_XMM0;
      }
      auVar16 = auVar25;
    }
  }
  else {
    local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar27 = tcu::getEffectiveTextureView
                       (&local_b8,
                        (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)&local_e8,&params->sampler);
    local_a8.m_levels = TVar27.m_levels;
    local_a8.m_numLevels = TVar27.m_numLevels;
    fVar26 = 0.0;
    local_190 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_190 = (params->super_RenderParams).bias;
    }
    if (0 < local_a8.m_numLevels) {
      fVar26 = (float)((local_a8.m_levels)->m_size).m_data[0];
    }
    iVar8 = dst->m_width;
    iVar10 = dst->m_height;
    tcu::operator*((tcu *)local_88,fVar26,&local_98);
    local_138.m_data[0] = local_98.m_data[0];
    local_138.m_data[1] = local_98.m_data[1];
    local_138.m_data[2] = local_98.m_data[2];
    VStack_12c.m_data[0] = local_98.m_data[3];
    VStack_12c.m_data[2] = local_98.m_data[1];
    VStack_12c.m_data[1] = local_98.m_data[2];
    local_108[0].m_numLevels = local_88[0];
    local_108[0]._4_4_ = local_88[1];
    local_108[0].m_levels = (ConstPixelBufferAccess *)CONCAT44(uStack_7c,uStack_80);
    local_58.m_data[0] = (params->super_RenderParams).w.m_data[0];
    local_58.m_data[1] = (params->super_RenderParams).w.m_data[1];
    local_58.m_data[2] = (params->super_RenderParams).w.m_data[2];
    fStack_4c = (params->super_RenderParams).w.m_data[3];
    local_48 = CONCAT44(local_58.m_data[1],local_58.m_data[2]);
    local_c0 = &(params->super_RenderParams).colorScale;
    local_c8 = &(params->super_RenderParams).colorBias;
    for (y = 0; y < dst->m_height; y = y + 1) {
      fVar26 = (float)y + 0.5;
      fVar23 = fVar26 / (float)iVar10;
      for (x_00 = 0; iVar1 = dst->m_width, x_00 < iVar1; x_00 = x_00 + 1) {
        wx = (float)x_00 + 0.5;
        fVar14 = wx / (float)iVar8;
        bVar2 = 1.0 <= fVar23 + fVar14;
        fVar13 = fVar23;
        fVar15 = fVar26;
        if (bVar2) {
          wx = (float)iVar8 - wx;
          fVar14 = 1.0 - fVar14;
          fVar13 = 1.0 - fVar23;
          fVar15 = (float)iVar10 - fVar26;
        }
        uVar9 = (ulong)bVar2;
        w = &local_58 + uVar9;
        fVar13 = projectedTriInterpolate(&local_138 + uVar9,w,fVar14,fVar13);
        width = (float)iVar1;
        local_118 = (float)dst->m_height;
        mode = params->lodMode;
        fVar14 = triDerivateX((Vec3 *)(&local_108[0].m_numLevels + uVar9 * 3),w,wx,width,
                              fVar15 / local_118);
        fVar15 = triDerivateY((Vec3 *)(&local_108[0].m_numLevels + uVar9 * 3),w,fVar15,local_118,
                              wx / width);
        fVar15 = computeLodFromDerivates(mode,fVar14,fVar15);
        execSample(local_40,&local_a8,params,fVar13,fVar15 + local_190);
        tcu::operator*((tcu *)local_78,(Vector<float,_4> *)local_40,local_c0);
        tcu::operator+((tcu *)local_68,(Vector<float,_4> *)local_78,local_c8);
        tcu::SurfaceAccess::setPixel(dst,(Vec4 *)local_68,x_00,y);
      }
    }
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&local_e8);
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture1DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture1DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, params);
	else
		sampleTextureNonProjected(dst, view, sq, params);
}